

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.c
# Opt level: O0

int packet_x11_open(LIBSSH2_SESSION *session,uchar *data,unsigned_long datalen,
                   packet_x11_open_state_t *x11open_state)

{
  uint uVar1;
  uint32_t uVar2;
  int iVar3;
  uchar *puVar4;
  uchar *s;
  LIBSSH2_CHANNEL *pLStack_50;
  int rc;
  LIBSSH2_CHANNEL *channel;
  uchar *p;
  unsigned_long packet_len;
  packet_x11_open_state_t *ppStack_30;
  int failure_code;
  packet_x11_open_state_t *x11open_state_local;
  unsigned_long datalen_local;
  uchar *data_local;
  LIBSSH2_SESSION *session_local;
  
  packet_len._4_4_ = 2;
  p = (uchar *)0x28;
  pLStack_50 = x11open_state->channel;
  ppStack_30 = x11open_state;
  x11open_state_local = (packet_x11_open_state_t *)datalen;
  datalen_local = (unsigned_long)data;
  data_local = (uchar *)session;
  if (x11open_state->state == libssh2_NB_state_idle) {
    uVar1 = _libssh2_ntohu32(data + 8);
    ppStack_30->sender_channel = uVar1;
    uVar1 = _libssh2_ntohu32(data + 0xc);
    ppStack_30->initial_window_size = uVar1;
    uVar1 = _libssh2_ntohu32(data + 0x10);
    ppStack_30->packet_size = uVar1;
    uVar1 = _libssh2_ntohu32(data + 0x14);
    ppStack_30->shost_len = uVar1;
    ppStack_30->shost = data + 0x18;
    uVar1 = _libssh2_ntohu32(data + 0x18 + ppStack_30->shost_len);
    ppStack_30->sport = uVar1;
    ppStack_30->state = libssh2_NB_state_allocated;
  }
  if (*(long *)(data_local + 0x40) == 0) {
    packet_len._4_4_ = 4;
    goto LAB_0012a063;
  }
  if (ppStack_30->state == libssh2_NB_state_allocated) {
    pLStack_50 = (LIBSSH2_CHANNEL *)_libssh2_calloc((LIBSSH2_SESSION *)data_local,0x2b0);
    if (pLStack_50 == (LIBSSH2_CHANNEL *)0x0) {
      _libssh2_error((LIBSSH2_SESSION *)data_local,-6,"allocate a channel for new connection");
      packet_len._4_4_ = 4;
      goto LAB_0012a063;
    }
    pLStack_50->session = (LIBSSH2_SESSION *)data_local;
    pLStack_50->channel_type_len = 3;
    puVar4 = (uchar *)(**(code **)(data_local + 8))(pLStack_50->channel_type_len + 1,data_local);
    pLStack_50->channel_type = puVar4;
    if (pLStack_50->channel_type == (uchar *)0x0) {
      _libssh2_error((LIBSSH2_SESSION *)data_local,-6,"allocate a channel for new connection");
      (**(code **)(data_local + 0x18))(pLStack_50,data_local);
      packet_len._4_4_ = 4;
      goto LAB_0012a063;
    }
    memcpy(pLStack_50->channel_type,"x11",(ulong)(pLStack_50->channel_type_len + 1));
    (pLStack_50->remote).id = ppStack_30->sender_channel;
    (pLStack_50->remote).window_size_initial = 0x200000;
    (pLStack_50->remote).window_size = 0x200000;
    (pLStack_50->remote).packet_size = 0x8000;
    uVar2 = _libssh2_channel_nextid((LIBSSH2_SESSION *)data_local);
    (pLStack_50->local).id = uVar2;
    (pLStack_50->local).window_size_initial = ppStack_30->initial_window_size;
    (pLStack_50->local).window_size = ppStack_30->initial_window_size;
    (pLStack_50->local).packet_size = ppStack_30->packet_size;
    channel = (LIBSSH2_CHANNEL *)(ppStack_30->packet + 1);
    ppStack_30->packet[0] = '[';
    _libssh2_store_u32((uchar **)&channel,(pLStack_50->remote).id);
    _libssh2_store_u32((uchar **)&channel,(pLStack_50->local).id);
    _libssh2_store_u32((uchar **)&channel,(pLStack_50->remote).window_size_initial);
    _libssh2_store_u32((uchar **)&channel,(pLStack_50->remote).packet_size);
    ppStack_30->state = libssh2_NB_state_created;
  }
  if (ppStack_30->state == libssh2_NB_state_created) {
    iVar3 = _libssh2_transport_send
                      ((LIBSSH2_SESSION *)data_local,ppStack_30->packet,0x11,(uchar *)0x0,0);
    if (iVar3 == -0x25) {
      return -0x25;
    }
    if (iVar3 != 0) {
      ppStack_30->state = libssh2_NB_state_idle;
      iVar3 = _libssh2_error((LIBSSH2_SESSION *)data_local,-7,
                             "Unable to send channel open confirmation");
      return iVar3;
    }
    _libssh2_list_add((list_head *)(data_local + 0x1d8),&pLStack_50->node);
    (*pLStack_50->session->x11)
              (pLStack_50->session,pLStack_50,(char *)ppStack_30->shost,ppStack_30->sport,
               &pLStack_50->session->abstract);
    ppStack_30->state = libssh2_NB_state_idle;
    return 0;
  }
LAB_0012a063:
  channel = (LIBSSH2_CHANNEL *)(ppStack_30->packet + 1);
  ppStack_30->packet[0] = '\\';
  _libssh2_store_u32((uchar **)&channel,ppStack_30->sender_channel);
  _libssh2_store_u32((uchar **)&channel,packet_len._4_4_);
  _libssh2_store_str((uchar **)&channel,"X11 Forward Unavailable",0x17);
  _libssh2_htonu32((uchar *)channel,0);
  iVar3 = _libssh2_transport_send
                    ((LIBSSH2_SESSION *)data_local,ppStack_30->packet,(size_t)p,(uchar *)0x0,0);
  if (iVar3 == -0x25) {
    session_local._4_4_ = -0x25;
  }
  else if (iVar3 == 0) {
    ppStack_30->state = libssh2_NB_state_idle;
    session_local._4_4_ = 0;
  }
  else {
    ppStack_30->state = libssh2_NB_state_idle;
    session_local._4_4_ =
         _libssh2_error((LIBSSH2_SESSION *)data_local,iVar3,"Unable to send open failure");
  }
  return session_local._4_4_;
}

Assistant:

static inline int
packet_x11_open(LIBSSH2_SESSION * session, unsigned char *data,
                unsigned long datalen,
                packet_x11_open_state_t *x11open_state)
{
    int failure_code = SSH_OPEN_CONNECT_FAILED;
    /* 17 = packet_type(1) + channel(4) + reason(4) + descr(4) + lang(4) */
    unsigned long packet_len = 17 + (sizeof(X11FwdUnAvil) - 1);
    unsigned char *p;
    LIBSSH2_CHANNEL *channel = x11open_state->channel;
    int rc;

    (void) datalen;

    if (x11open_state->state == libssh2_NB_state_idle) {
        unsigned char *s = data + (sizeof("x11") - 1) + 5;
        x11open_state->sender_channel = _libssh2_ntohu32(s);
        s += 4;
        x11open_state->initial_window_size = _libssh2_ntohu32(s);
        s += 4;
        x11open_state->packet_size = _libssh2_ntohu32(s);
        s += 4;
        x11open_state->shost_len = _libssh2_ntohu32(s);
        s += 4;
        x11open_state->shost = s;
        s += x11open_state->shost_len;
        x11open_state->sport = _libssh2_ntohu32(s);

        _libssh2_debug(session, LIBSSH2_TRACE_CONN,
                       "X11 Connection Received from %s:%ld on channel %lu",
                       x11open_state->shost, x11open_state->sport,
                       x11open_state->sender_channel);

        x11open_state->state = libssh2_NB_state_allocated;
    }

    if (session->x11) {
        if (x11open_state->state == libssh2_NB_state_allocated) {
            channel = LIBSSH2_CALLOC(session, sizeof(LIBSSH2_CHANNEL));
            if (!channel) {
                _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                               "allocate a channel for new connection");
                failure_code = SSH_OPEN_RESOURCE_SHORTAGE;
                goto x11_exit;
            }

            channel->session = session;
            channel->channel_type_len = sizeof("x11") - 1;
            channel->channel_type = LIBSSH2_ALLOC(session,
                                                  channel->channel_type_len +
                                                  1);
            if (!channel->channel_type) {
                _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                               "allocate a channel for new connection");
                LIBSSH2_FREE(session, channel);
                failure_code = SSH_OPEN_RESOURCE_SHORTAGE;
                goto x11_exit;
            }
            memcpy(channel->channel_type, "x11",
                   channel->channel_type_len + 1);

            channel->remote.id = x11open_state->sender_channel;
            channel->remote.window_size_initial =
                LIBSSH2_CHANNEL_WINDOW_DEFAULT;
            channel->remote.window_size = LIBSSH2_CHANNEL_WINDOW_DEFAULT;
            channel->remote.packet_size = LIBSSH2_CHANNEL_PACKET_DEFAULT;

            channel->local.id = _libssh2_channel_nextid(session);
            channel->local.window_size_initial =
                x11open_state->initial_window_size;
            channel->local.window_size = x11open_state->initial_window_size;
            channel->local.packet_size = x11open_state->packet_size;

            _libssh2_debug(session, LIBSSH2_TRACE_CONN,
                           "X11 Connection established: channel %lu/%lu "
                           "win %lu/%lu packet %lu/%lu",
                           channel->local.id, channel->remote.id,
                           channel->local.window_size,
                           channel->remote.window_size,
                           channel->local.packet_size,
                           channel->remote.packet_size);
            p = x11open_state->packet;
            *(p++) = SSH_MSG_CHANNEL_OPEN_CONFIRMATION;
            _libssh2_store_u32(&p, channel->remote.id);
            _libssh2_store_u32(&p, channel->local.id);
            _libssh2_store_u32(&p, channel->remote.window_size_initial);
            _libssh2_store_u32(&p, channel->remote.packet_size);

            x11open_state->state = libssh2_NB_state_created;
        }

        if (x11open_state->state == libssh2_NB_state_created) {
            rc = _libssh2_transport_send(session, x11open_state->packet, 17,
                                         NULL, 0);
            if (rc == LIBSSH2_ERROR_EAGAIN) {
                return rc;
            } else if (rc) {
                x11open_state->state = libssh2_NB_state_idle;
                return _libssh2_error(session, LIBSSH2_ERROR_SOCKET_SEND,
                                      "Unable to send channel open "
                                      "confirmation");
            }

            /* Link the channel into the session */
            _libssh2_list_add(&session->channels, &channel->node);

            /*
             * Pass control to the callback, they may turn right around and
             * free the channel, or actually use it
             */
            LIBSSH2_X11_OPEN(channel, (char *)x11open_state->shost,
                             x11open_state->sport);

            x11open_state->state = libssh2_NB_state_idle;
            return 0;
        }
    }
    else
        failure_code = SSH_OPEN_RESOURCE_SHORTAGE;
    /* fall-trough */
  x11_exit:
    p = x11open_state->packet;
    *(p++) = SSH_MSG_CHANNEL_OPEN_FAILURE;
    _libssh2_store_u32(&p, x11open_state->sender_channel);
    _libssh2_store_u32(&p, failure_code);
    _libssh2_store_str(&p, X11FwdUnAvil, sizeof(X11FwdUnAvil) - 1);
    _libssh2_htonu32(p, 0);

    rc = _libssh2_transport_send(session, x11open_state->packet, packet_len,
                                 NULL, 0);
    if (rc == LIBSSH2_ERROR_EAGAIN) {
        return rc;
    } else if (rc) {
        x11open_state->state = libssh2_NB_state_idle;
        return _libssh2_error(session, rc, "Unable to send open failure");
    }
    x11open_state->state = libssh2_NB_state_idle;
    return 0;
}